

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O3

void __thiscall diy::Bounds<long>::Bounds(Bounds<long> *this,int dim)

{
  allocator<long> local_29;
  long local_28;
  
  local_28 = 0;
  itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::small_vector
            ((small_vector<long,_4UL,_0UL,_std::allocator<long>_> *)this,(long)dim,&local_28,
             &local_29);
  local_28 = 0;
  itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::small_vector
            (&(this->max).super_small_vector<long,_4UL,_0UL,_std::allocator<long>_>,(long)dim,
             &local_28,&local_29);
  return;
}

Assistant:

Bounds(int dim): min(dim), max(dim)                                 {}